

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

TagState * __thiscall
despot::BaseTag::MostLikelyState
          (BaseTag *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  State *pSVar1;
  int iVar2;
  int iVar3;
  pointer ppSVar4;
  pointer ppSVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  allocator_type local_31;
  double local_30;
  
  if ((MostLikelyState(std::vector<despot::State*,std::allocator<despot::State*>>const&)::probs ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&MostLikelyState(std::vector<despot::State*,std::allocator<despot::State*>>const&)
                                   ::probs), iVar3 != 0)) {
    iVar3 = (**(code **)(*(long *)this + 0x10))(this);
    std::vector<double,_std::allocator<double>_>::vector
              (&MostLikelyState::probs,(long)iVar3,&local_31);
    __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,&MostLikelyState::probs,
                 &__dso_handle);
    __cxa_guard_release(&MostLikelyState(std::vector<despot::State*,std::allocator<despot::State*>>const&)
                         ::probs);
  }
  ppSVar4 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar5 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar5 == ppSVar4) {
    lVar7 = -1;
  }
  else {
    dVar8 = 0.0;
    uVar6 = 0;
    iVar3 = -1;
    do {
      pSVar1 = ppSVar4[uVar6];
      local_30 = dVar8;
      iVar2 = (**(code **)(*(long *)this + 0x58))(this,pSVar1);
      dVar8 = *(double *)(pSVar1 + 0x18) +
              MostLikelyState::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar2];
      MostLikelyState::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2] = dVar8;
      if (dVar8 <= local_30) {
        dVar8 = local_30;
        iVar2 = iVar3;
      }
      uVar6 = uVar6 + 1;
      ppSVar4 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      ppSVar5 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      iVar3 = iVar2;
    } while (uVar6 < (ulong)((long)ppSVar5 - (long)ppSVar4 >> 3));
    lVar7 = (long)iVar2;
  }
  if (ppSVar5 != ppSVar4) {
    uVar6 = 0;
    do {
      iVar3 = (**(code **)(*(long *)this + 0x58))(this,ppSVar4[uVar6]);
      MostLikelyState::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar3] = 0.0;
      uVar6 = uVar6 + 1;
      ppSVar4 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(particles->
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3)
            );
  }
  return (this->states_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar7];
}

Assistant:

const TagState& BaseTag::MostLikelyState(
	const vector<State*>& particles) const {
	static vector<double> probs = vector<double>(NumStates());

	double maxWeight = 0;
	int bestId = -1;
	for (int i = 0; i < particles.size(); i++) {
		TagState* tagstate = static_cast<TagState*>(particles[i]);
		int id = GetIndex(tagstate);
		probs[id] += tagstate->weight;

		if (probs[id] > maxWeight) {
			maxWeight = probs[id];
			bestId = id;
		}
	}

	for (int i = 0; i < particles.size(); i++) {
		TagState* tagstate = static_cast<TagState*>(particles[i]);
		probs[GetIndex(tagstate)] = 0;
	}

	return *states_[bestId];
}